

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O2

p_ply_property ply_grow_property(p_ply ply,p_ply_element element)

{
  p_ply_property ptVar1;
  
  ptVar1 = (p_ply_property)ply_grow_array(ply,&element->property,&element->nproperties,0x128);
  if (ptVar1 != (p_ply_property)0x0) {
    ptVar1->name[0] = '\0';
    ptVar1->type = ~PLY_INT8;
    ptVar1->value_type = ~PLY_INT8;
    ptVar1->length_type = ~PLY_INT8;
    ptVar1->idata = 0;
    ptVar1->read_cb = (p_ply_read_cb)0x0;
    ptVar1->pdata = (void *)0x0;
  }
  return ptVar1;
}

Assistant:

static p_ply_property ply_grow_property(p_ply ply, p_ply_element element) {
    p_ply_property property = NULL;
    assert(ply);
    assert(element);
    assert(element->property || element->nproperties == 0);
    assert(!element->property || element->nproperties > 0);
    property = (p_ply_property)ply_grow_array(ply, (void **)&element->property,
                                              &element->nproperties,
                                              sizeof(t_ply_property));
    if (!property) return NULL;
    ply_property_init(property);
    return property;
}